

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Example.cpp
# Opt level: O2

void __thiscall Nova::Example<float,_2>::Write_Frame_Title(Example<float,_2> *this,int frame)

{
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->write_frame_title == true) {
    std::operator+(&local_70,&this->output_directory,"/");
    std::__cxx11::to_string(&local_90,frame);
    std::operator+(&local_50,&local_70,&local_90);
    std::operator+(&local_30,&local_50,"/frame_title");
    File_Utilities::Write_To_Text_File<std::__cxx11::string>(&local_30,&this->frame_title);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void Example<T,d>::
Write_Frame_Title(const int frame) const
{
    if(write_frame_title) File_Utilities::Write_To_Text_File(output_directory+"/"+std::to_string(frame)+"/frame_title",frame_title);
}